

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_api_loader.cpp
# Opt level: O1

int getDebugCurrentLine(lua_Debug *ar)

{
  if (luaVersion - LUA_JIT < 5) {
    return *(int *)((long)&ar->u + *(long *)(&DAT_00162508 + (ulong)(luaVersion - LUA_JIT) * 8));
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/api/lua_api_loader.cpp"
                ,0xb0,"int getDebugCurrentLine(lua_Debug *)");
}

Assistant:

int getDebugCurrentLine(lua_Debug* ar)
{
	switch (luaVersion)
	{
	case LuaVersion::LUA_JIT:
	case LuaVersion::LUA_51:
		return ar->u.ar51.currentline;
	case LuaVersion::LUA_52:
		return ar->u.ar52.currentline;
	case LuaVersion::LUA_53:
		return ar->u.ar53.currentline;
	case LuaVersion::LUA_54:
		return ar->u.ar54.currentline;
	default:
		assert(false);
		return 0;
	}
}